

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

void construct_block_size_descriptor_3d
               (uint x_texels,uint y_texels,uint z_texels,block_size_descriptor *bsd)

{
  bool bVar1;
  undefined2 uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  char *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int decimation_mode;
  bool valid;
  uint weight_bits;
  uint quant_mode;
  bool is_dual_plane;
  uint z_weights_1;
  uint y_weights_1;
  uint x_weights_1;
  uint i_4;
  uint j;
  uint bm_counts [2];
  uint packed_idx;
  uint i_3;
  uint i_2;
  uint bits_2planes;
  uint bits_1plane;
  uint i_1;
  int maxprec_2planes;
  int maxprec_1plane;
  decimation_info *di;
  uint weight_count;
  uint z_weights;
  uint y_weights;
  uint x_weights;
  uint i;
  dt_init_working_buffers *wb;
  uint decimation_mode_count;
  int decimation_mode_index [438];
  quant_method in_stack_fffffffffffff87c;
  undefined8 in_stack_fffffffffffff880;
  int local_770;
  undefined4 local_76c;
  uint in_stack_fffffffffffff898;
  uint in_stack_fffffffffffff89c;
  uint in_stack_fffffffffffff8a0;
  uint in_stack_fffffffffffff8a4;
  uint uVar6;
  uint uVar7;
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  uint uVar8;
  uint local_734;
  uint in_stack_fffffffffffff8d0;
  uint in_stack_fffffffffffff8d4;
  uint local_718;
  uint local_714;
  uint local_710;
  uint local_70c;
  uint local_6fc;
  uint auStack_6f8 [26];
  uint in_stack_fffffffffffff970;
  uint in_stack_fffffffffffff974;
  uint in_stack_fffffffffffff978;
  uint in_stack_fffffffffffff97c;
  uint in_stack_fffffffffffff980;
  uint in_stack_fffffffffffff984;
  decimation_info *in_stack_fffffffffffff9a0;
  dt_init_working_buffers *in_stack_fffffffffffff9a8;
  
  local_6fc = 0;
  pvVar5 = operator_new(0x73d8);
  *in_RCX = (char)in_EDI;
  in_RCX[1] = (char)in_ESI;
  in_RCX[2] = (char)in_EDX;
  in_RCX[3] = (char)in_EDI * (char)in_ESI * (char)in_EDX;
  for (local_70c = 0; local_70c < 0x1b6; local_70c = local_70c + 1) {
    auStack_6f8[local_70c] = 0xffffffff;
  }
  for (local_710 = 2; uVar3 = local_6fc, local_710 <= in_EDI; local_710 = local_710 + 1) {
    for (local_714 = 2; local_714 <= in_ESI; local_714 = local_714 + 1) {
      for (local_718 = 2; local_718 <= in_EDX; local_718 = local_718 + 1) {
        uVar3 = local_710 * local_714 * local_718;
        if (uVar3 < 0x41) {
          auStack_6f8[local_718 * 0x40 + local_714 * 8 + local_710] = local_6fc;
          init_decimation_info_3d
                    (in_stack_fffffffffffff984,in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
                     in_stack_fffffffffffff978,in_stack_fffffffffffff974,in_stack_fffffffffffff970,
                     in_stack_fffffffffffff9a0,in_stack_fffffffffffff9a8);
          in_stack_fffffffffffff8d4 = 0xffffffff;
          in_stack_fffffffffffff8d0 = 0xffffffff;
          for (local_734 = 0; local_734 < 0xc; local_734 = local_734 + 1) {
            uVar4 = get_ise_sequence_bitcount
                              ((uint)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
            if ((0x17 < uVar4) && (uVar4 < 0x61)) {
              in_stack_fffffffffffff8d4 = local_734;
            }
            uVar4 = get_ise_sequence_bitcount
                              ((uint)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
            if ((0x17 < uVar4) && (uVar4 < 0x61)) {
              in_stack_fffffffffffff8d0 = local_734;
            }
          }
          if (0x40 < uVar3 * 2) {
            in_stack_fffffffffffff8d0 = 0xffffffff;
          }
          in_RCX[(ulong)local_6fc * 6 + 0x40] = (char)in_stack_fffffffffffff8d4;
          in_RCX[(ulong)local_6fc * 6 + 0x41] = (char)in_stack_fffffffffffff8d0;
          uVar2 = 0xffff;
          if (in_stack_fffffffffffff8d4 == 0xffffffff) {
            uVar2 = 0;
          }
          *(undefined2 *)(in_RCX + (ulong)local_6fc * 6 + 0x42) = uVar2;
          uVar2 = 0xffff;
          if (in_stack_fffffffffffff8d0 == 0xffffffff) {
            uVar2 = 0;
          }
          *(undefined2 *)(in_RCX + (ulong)local_6fc * 6 + 0x44) = uVar2;
          local_6fc = local_6fc + 1;
        }
      }
    }
  }
  for (; uVar3 < 0x57; uVar3 = uVar3 + 1) {
    in_RCX[(ulong)uVar3 * 6 + 0x40] = -1;
    in_RCX[(ulong)uVar3 * 6 + 0x41] = -1;
    (in_RCX + (ulong)uVar3 * 6 + 0x42)[0] = '\0';
    (in_RCX + (ulong)uVar3 * 6 + 0x42)[1] = '\0';
    (in_RCX + (ulong)uVar3 * 6 + 0x44)[0] = '\0';
    (in_RCX + (ulong)uVar3 * 6 + 0x44)[1] = '\0';
  }
  in_RCX[4] = '\0';
  in_RCX[5] = '\0';
  in_RCX[6] = '\0';
  in_RCX[7] = '\0';
  *(uint *)(in_RCX + 8) = local_6fc;
  *(uint *)(in_RCX + 0xc) = local_6fc;
  for (uVar4 = 0; uVar4 < 0x800; uVar4 = uVar4 + 1) {
    (in_RCX + (ulong)uVar4 * 2 + 0xac7ae0)[0] = -1;
    (in_RCX + (ulong)uVar4 * 2 + 0xac7ae0)[1] = -1;
  }
  uVar8 = 0;
  memset(&stack0xfffffffffffff8b0,0,8);
  uVar7 = 0;
  do {
    if (1 < uVar7) {
      in_RCX[0x10] = '\0';
      in_RCX[0x11] = '\0';
      in_RCX[0x12] = '\0';
      in_RCX[0x13] = '\0';
      *(int *)(in_RCX + 0x14) = in_stack_fffffffffffff8b0;
      *(int *)(in_RCX + 0x18) = in_stack_fffffffffffff8b0 + in_stack_fffffffffffff8b4;
      *(int *)(in_RCX + 0x1c) = in_stack_fffffffffffff8b0 + in_stack_fffffffffffff8b4;
      assign_kmeans_texels
                ((block_size_descriptor *)
                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,0x73d8);
      }
      return;
    }
    for (uVar6 = 0; uVar6 < 0x800; uVar6 = uVar6 + 1) {
      if ((((((*(short *)(in_RCX + (ulong)uVar6 * 2 + 0xac7ae0) == -1) &&
             (bVar1 = decode_block_mode_3d
                                (uVar3,(uint *)CONCAT44(uVar4,uVar8),
                                 (uint *)CONCAT44(in_stack_fffffffffffff8b4,
                                                  in_stack_fffffffffffff8b0),
                                 (uint *)CONCAT44(uVar7,uVar6),
                                 (bool *)CONCAT44(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0),
                                 (uint *)CONCAT44(in_stack_fffffffffffff89c,
                                                  in_stack_fffffffffffff898),
                                 (uint *)CONCAT44(in_stack_fffffffffffff8d4,
                                                  in_stack_fffffffffffff8d0)), bVar1)) &&
            (in_stack_fffffffffffff8a4 <= in_EDI)) &&
           ((in_stack_fffffffffffff8a0 <= in_ESI && (in_stack_fffffffffffff89c <= in_EDX)))) &&
          ((uVar7 != 0 || ((in_stack_fffffffffffff898 & 0x1000000) == 0)))) &&
         ((uVar7 != 1 || ((in_stack_fffffffffffff898 & 0x1000000) != 0)))) {
        if ((in_stack_fffffffffffff898 & 0x1000000) == 0) {
          if (local_770 != 0x6f) goto LAB_0056320b;
        }
        else if (local_770 != 0x6d) {
LAB_0056320b:
          in_RCX[(ulong)uVar8 * 6 + 0xac8ae2] =
               (char)auStack_6f8
                     [in_stack_fffffffffffff89c * 0x40 + in_stack_fffffffffffff8a0 * 8 +
                      in_stack_fffffffffffff8a4];
          in_RCX[(ulong)uVar8 * 6 + 0xac8ae3] = (char)local_76c;
          in_RCX[(ulong)uVar8 * 6 + 0xac8ae4] = (char)local_770;
          in_RCX[(ulong)uVar8 * 6 + 0xac8ae5] =
               in_RCX[(ulong)uVar8 * 6 + 0xac8ae5] & 0xfeU |
               (byte)(in_stack_fffffffffffff898 >> 0x18) & 1;
          *(short *)(in_RCX + (ulong)uVar8 * 6 + 0xac8ae0) = (short)uVar6;
          *(short *)(in_RCX + (ulong)uVar6 * 2 + 0xac7ae0) = (short)uVar8;
          *(int *)(&stack0xfffffffffffff8b0 + (ulong)uVar7 * 4) =
               *(int *)(&stack0xfffffffffffff8b0 + (ulong)uVar7 * 4) + 1;
          uVar8 = uVar8 + 1;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void construct_block_size_descriptor_3d(
	unsigned int x_texels,
	unsigned int y_texels,
	unsigned int z_texels,
	block_size_descriptor& bsd
) {
	// Store a remap table for storing packed decimation modes.
	// Indexing uses [Z * 64 + Y *  8 + X] and max size for each axis is 6.
	static constexpr unsigned int MAX_DMI = 6 * 64 + 6 * 8 + 6;
	int decimation_mode_index[MAX_DMI];
	unsigned int decimation_mode_count = 0;

	dt_init_working_buffers* wb = new dt_init_working_buffers;

	bsd.xdim = static_cast<uint8_t>(x_texels);
	bsd.ydim = static_cast<uint8_t>(y_texels);
	bsd.zdim = static_cast<uint8_t>(z_texels);
	bsd.texel_count = static_cast<uint8_t>(x_texels * y_texels * z_texels);

	for (unsigned int i = 0; i < MAX_DMI; i++)
	{
		decimation_mode_index[i] = -1;
	}

	// gather all the infill-modes that can be used with the current block size
	for (unsigned int x_weights = 2; x_weights <= x_texels; x_weights++)
	{
		for (unsigned int y_weights = 2; y_weights <= y_texels; y_weights++)
		{
			for (unsigned int z_weights = 2; z_weights <= z_texels; z_weights++)
			{
				unsigned int weight_count = x_weights * y_weights * z_weights;
				if (weight_count > BLOCK_MAX_WEIGHTS)
				{
					continue;
				}

				decimation_info& di = bsd.decimation_tables[decimation_mode_count];
				decimation_mode_index[z_weights * 64 + y_weights * 8 + x_weights] = decimation_mode_count;
				init_decimation_info_3d(x_texels, y_texels, z_texels, x_weights, y_weights, z_weights, di, *wb);

				int maxprec_1plane = -1;
				int maxprec_2planes = -1;
				for (unsigned int i = 0; i < 12; i++)
				{
					unsigned int bits_1plane = get_ise_sequence_bitcount(weight_count, static_cast<quant_method>(i));
					if (bits_1plane >= BLOCK_MIN_WEIGHT_BITS && bits_1plane <= BLOCK_MAX_WEIGHT_BITS)
					{
						maxprec_1plane = i;
					}

					unsigned int bits_2planes = get_ise_sequence_bitcount(2 * weight_count, static_cast<quant_method>(i));
					if (bits_2planes >= BLOCK_MIN_WEIGHT_BITS && bits_2planes <= BLOCK_MAX_WEIGHT_BITS)
					{
						maxprec_2planes = i;
					}
				}

				if ((2 * weight_count) > BLOCK_MAX_WEIGHTS)
				{
					maxprec_2planes = -1;
				}

				bsd.decimation_modes[decimation_mode_count].maxprec_1plane = static_cast<int8_t>(maxprec_1plane);
				bsd.decimation_modes[decimation_mode_count].maxprec_2planes = static_cast<int8_t>(maxprec_2planes);
				bsd.decimation_modes[decimation_mode_count].refprec_1plane = maxprec_1plane == -1 ? 0 : 0xFFFF;
				bsd.decimation_modes[decimation_mode_count].refprec_2planes = maxprec_2planes == -1 ? 0 : 0xFFFF;
				decimation_mode_count++;
			}
		}
	}

	// Ensure the end of the array contains valid data (should never get read)
	for (unsigned int i = decimation_mode_count; i < WEIGHTS_MAX_DECIMATION_MODES; i++)
	{
		bsd.decimation_modes[i].maxprec_1plane = -1;
		bsd.decimation_modes[i].maxprec_2planes = -1;
		bsd.decimation_modes[i].refprec_1plane = 0;
		bsd.decimation_modes[i].refprec_2planes = 0;
	}

	bsd.decimation_mode_count_always = 0; // Skipped for 3D modes
	bsd.decimation_mode_count_selected = decimation_mode_count;
	bsd.decimation_mode_count_all = decimation_mode_count;

	// Construct the list of block formats referencing the decimation tables

	// Clear the list to a known-bad value
	for (unsigned int i = 0; i < WEIGHTS_MAX_BLOCK_MODES; i++)
	{
		bsd.block_mode_packed_index[i] = BLOCK_BAD_BLOCK_MODE;
	}

	unsigned int packed_idx = 0;
	unsigned int bm_counts[2] { 0 };

	// Iterate two times to build a usefully ordered list:
	//   - Pass 0 - keep valid single plane block modes
	//   - Pass 1 - keep valid dual plane block modes
	for (unsigned int j = 0; j < 2; j++)
	{
		for (unsigned int i = 0; i < WEIGHTS_MAX_BLOCK_MODES; i++)
		{
			// Skip modes we've already included in a previous pass
			if (bsd.block_mode_packed_index[i] != BLOCK_BAD_BLOCK_MODE)
			{
				continue;
			}

			unsigned int x_weights;
			unsigned int y_weights;
			unsigned int z_weights;
			bool is_dual_plane;
			unsigned int quant_mode;
			unsigned int weight_bits;

			bool valid = decode_block_mode_3d(i, x_weights, y_weights, z_weights, is_dual_plane, quant_mode, weight_bits);
			// Skip invalid encodings
			if (!valid || x_weights > x_texels || y_weights > y_texels || z_weights > z_texels)
			{
				continue;
			}

			// Skip encodings in the wrong iteration
			if ((j == 0 && is_dual_plane) || (j == 1 && !is_dual_plane))
			{
				continue;
			}

			// Always skip encodings we can't physically encode based on bit availability
			if (is_dual_plane)
			{
				 // This is the only check we need as only support 1 partition
				 if ((109 - weight_bits) <= 0)
				 {
					continue;
				 }
			}
			else
			{
				// This is conservative - fewer bits may be available for > 1 partition
				 if ((111 - weight_bits) <= 0)
				 {
					continue;
				 }
			}

			int decimation_mode = decimation_mode_index[z_weights * 64 + y_weights * 8 + x_weights];
			bsd.block_modes[packed_idx].decimation_mode = static_cast<uint8_t>(decimation_mode);
			bsd.block_modes[packed_idx].quant_mode = static_cast<uint8_t>(quant_mode);
			bsd.block_modes[packed_idx].weight_bits = static_cast<uint8_t>(weight_bits);
			bsd.block_modes[packed_idx].is_dual_plane = static_cast<uint8_t>(is_dual_plane);
			bsd.block_modes[packed_idx].mode_index = static_cast<uint16_t>(i);

			bsd.block_mode_packed_index[i] = static_cast<uint16_t>(packed_idx);
			bm_counts[j]++;
			packed_idx++;
		}
	}

	bsd.block_mode_count_1plane_always = 0;  // Skipped for 3D modes
	bsd.block_mode_count_1plane_selected = bm_counts[0];
	bsd.block_mode_count_1plane_2plane_selected = bm_counts[0] + bm_counts[1];
	bsd.block_mode_count_all = bm_counts[0] + bm_counts[1];

	// Determine the texels to use for kmeans clustering.
	assign_kmeans_texels(bsd);

	delete wb;
}